

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O0

UBool __thiscall
icu_63::CurrencyPluralInfo::operator==(CurrencyPluralInfo *this,CurrencyPluralInfo *info)

{
  UBool UVar1;
  int iVar2;
  bool local_19;
  CurrencyPluralInfo *info_local;
  CurrencyPluralInfo *this_local;
  
  iVar2 = (*(this->fPluralRules->super_UObject)._vptr_UObject[3])
                    (this->fPluralRules,info->fPluralRules);
  local_19 = false;
  if ((char)iVar2 != '\0') {
    UVar1 = Locale::operator==(this->fLocale,info->fLocale);
    local_19 = false;
    if (UVar1 != '\0') {
      UVar1 = Hashtable::equals(this->fPluralCountToCurrencyUnitPattern,
                                info->fPluralCountToCurrencyUnitPattern);
      local_19 = UVar1 != '\0';
    }
  }
  return local_19;
}

Assistant:

UBool
CurrencyPluralInfo::operator==(const CurrencyPluralInfo& info) const {
#ifdef CURRENCY_PLURAL_INFO_DEBUG
    if (*fPluralRules == *info.fPluralRules) {
        std::cout << "same plural rules\n";
    }
    if (*fLocale == *info.fLocale) {
        std::cout << "same locale\n";
    }
    if (fPluralCountToCurrencyUnitPattern->equals(*info.fPluralCountToCurrencyUnitPattern)) {
        std::cout << "same pattern\n";
    }
#endif
    return *fPluralRules == *info.fPluralRules &&
           *fLocale == *info.fLocale &&
           fPluralCountToCurrencyUnitPattern->equals(*info.fPluralCountToCurrencyUnitPattern);
}